

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Aig_Man_t * Saig_BmcIntervalToAig(Saig_Bmc_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  void *pvVar2;
  Aig_Man_t *p_01;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_2c;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Saig_Bmc_t *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->pFrm->vObjs);
    if (iVar1 <= local_2c) {
      p_01 = Aig_ManStart(p->nNodesMax);
      pAVar3 = Aig_ManConst1(p_01);
      pAVar4 = Aig_ManConst1(p->pFrm);
      (pAVar4->field_5).pData = pAVar3;
      Vec_IntClear(p->vVisited);
      p_00 = p->vVisited;
      pAVar3 = Aig_ManConst1(p->pFrm);
      iVar1 = Aig_ObjId(pAVar3);
      Vec_IntPush(p_00,iVar1);
      local_2c = 0;
      while( true ) {
        iVar1 = Vec_PtrSize(p->vTargets);
        if (iVar1 <= local_2c) {
          return p_01;
        }
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vTargets,local_2c);
        pAVar3 = Aig_Regular(pAVar3);
        pAVar3 = Saig_BmcIntervalToAig_rec(p,p_01,pAVar3);
        iVar1 = Aig_IsComplement(pAVar3);
        if (iVar1 != 0) break;
        Aig_ObjCreateCo(p_01,pAVar3);
        local_2c = local_2c + 1;
      }
      __assert_fail("!Aig_IsComplement(pObjNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                    ,0x22b,"Aig_Man_t *Saig_BmcIntervalToAig(Saig_Bmc_t *)");
    }
    pvVar2 = Vec_PtrEntry(p->pFrm->vObjs,local_2c);
    if ((pvVar2 != (void *)0x0) && (*(long *)((long)pvVar2 + 0x28) != 0)) break;
    local_2c = local_2c + 1;
  }
  __assert_fail("pObj->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                ,0x221,"Aig_Man_t *Saig_BmcIntervalToAig(Saig_Bmc_t *)");
}

Assistant:

Aig_Man_t * Saig_BmcIntervalToAig( Saig_Bmc_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    Aig_ManForEachObj( p->pFrm, pObj, i )
        assert( pObj->pData == NULL );

    pNew = Aig_ManStart( p->nNodesMax );
    Aig_ManConst1(p->pFrm)->pData = Aig_ManConst1(pNew);
    Vec_IntClear( p->vVisited );
    Vec_IntPush( p->vVisited, Aig_ObjId(Aig_ManConst1(p->pFrm)) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
    {
//        assert( !Aig_ObjIsConst1(Aig_Regular(pObj)) );
        pObjNew = Saig_BmcIntervalToAig_rec( p, pNew, Aig_Regular(pObj) );
        assert( !Aig_IsComplement(pObjNew) );
        Aig_ObjCreateCo( pNew, pObjNew );
    } 
    return pNew;
}